

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O0

void __thiscall
sqlite_orm::internal::storage_impl<$78c9f6e0$>::copy_table
          (storage_impl<_78c9f6e0_> *this,sqlite3 *db,string *name,
          vector<sqlite_orm::table_info_*,_std::allocator<sqlite_orm::table_info_*>_>
          *columnsToIgnore)

{
  int iVar1;
  ostream *poVar2;
  reference pvVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  error_category *peVar6;
  vector<sqlite_orm::table_info_*,_std::allocator<sqlite_orm::table_info_*>_> *in_RCX;
  string *in_RDX;
  undefined8 in_RSI;
  string *in_RDI;
  statement_finalizer finalizer;
  sqlite3_stmt *stmt;
  __string_type query;
  size_t i_1;
  size_t i;
  size_type columnNamesCount;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  columnNames;
  stringstream ss;
  anon_class_16_2_825b6b41 *in_stack_fffffffffffffd38;
  table_t<_45d12b31_> *in_stack_fffffffffffffd40;
  char *in_stack_fffffffffffffdb8;
  system_error *in_stack_fffffffffffffdc0;
  error_code in_stack_fffffffffffffdc8;
  statement_finalizer local_228;
  sqlite3_stmt *local_220;
  string local_218 [32];
  size_type local_1f8;
  size_type local_1f0;
  size_type local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1d0;
  vector<sqlite_orm::table_info_*,_std::allocator<sqlite_orm::table_info_*>_> *local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  stringstream local_1a8 [16];
  ostream local_198;
  vector<sqlite_orm::table_info_*,_std::allocator<sqlite_orm::table_info_*>_> *local_20;
  string *local_18;
  undefined8 local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,in_RCX);
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1c0);
  local_1c8 = local_20;
  local_1d0 = &local_1c0;
  table_t<relive::Track,sqlite_orm::internal::column_t<relive::Track,long,long_const&(relive::Track::*)()const,void(relive::Track::*)(long),sqlite_orm::constraints::autoincrement_t,sqlite_orm::constraints::primary_key_t<>>,sqlite_orm::internal::column_t<relive::Track,long,long_const&(relive::Track::*)()const,void(relive::Track::*)(long)>,sqlite_orm::internal::column_t<relive::Track,std::__cxx11::string,std::__cxx11::string_const&(relive::Track::*)()const,void(relive::Track::*)(std::__cxx11::string)>,sqlite_orm::internal::column_t<relive::Track,std::__cxx11::string,std::__cxx11::string_const&(relive::Track::*)()const,void(relive::Track::*)(std::__cxx11::string)>,sqlite_orm::internal::column_t<relive::Track,int,int_const&(relive::Track::*)()const,void(relive::Track::*)(int)>,sqlite_orm::internal::column_t<relive::Track,long,long_const&(relive::Track::*)()const,void(relive::Track::*)(long)>,sqlite_orm::internal::column_t<relive::Track,long,long_const&(relive::Track::*)()const,void(relive::Track::*)(long)>,sqlite_orm::internal::column_t<relive::Track,int,int_const&(relive::Track::*)()const,void(relive::Track::*)(int)>,sqlite_orm::internal::column_t<relive::Track,std::__cxx11::string,std::__cxx11::string_const&(relive::Track::*)()const,void(relive::Track::*)(std::__cxx11::string)>,sqlite_orm::constraints::foreign_key_t<std::tuple<long_relive::Track::*>,std::tuple<long_relive::Stream::*>>>
  ::
  for_each_column<sqlite_orm::internal::storage_impl<sqlite_orm::internal::table_t<relive::Track,sqlite_orm::internal::column_t<relive::Track,long,long_const&(relive::Track::*)()const,void(relive::Track::*)(long),sqlite_orm::constraints::autoincrement_t,sqlite_orm::constraints::primary_key_t<>>,sqlite_orm::internal::column_t<relive::Track,long,long_const&(relive::Track::*)()const,void(relive::Track::*)(long)>,sqlite_orm::internal::column_t<relive::Track,std::__cxx11::string,std::__cxx11::string_const&(relive::Track::*)()const,void(relive::Track::*)(std::__cxx11::string)>,sqlite_orm::internal::column_t<relive::Track,std::__cxx11::string,std::__cxx11::string_const&(relive::Track::*)()const,void(relive::Track::*)(std::__cxx11::string)>,sqlite_orm::internal::column_t<relive::Track,int,int_const&(relive::Track::*)()const,void(relive::Track::*)(int)>,sqlite_orm::internal::column_t<relive::Track,long,long_const&(relive::Track::*)()const,void(relive::Track::*)(long)>,sqlite_orm::internal::column_t<relive::Track,long,long_const&(relive::Track::*)()const,void(relive::Track::*)(long)>,sqlite_orm::internal::column_t<relive::Track,int,int_const&(relive::Track::*)()const,void(relive::Track::*)(int)>,sqlite_orm::internal::column_t<relive::Track,std::__cxx11::string,std::__cxx11::string_const&(relive::Track::*)()const,void(relive::Track::*)(std::__cxx11::string)>,sqlite_orm::constraints::foreign_key_t<std::tuple<long_relive::Track::*>,std::tuple<long_relive::Stream::*>>>>::copy_table(sqlite3*,std::__cxx11::string_const&,std::vector<sqlite_orm::table_info*,std::allocator<sqlite_orm::table_info*>>const&)const::_lambda(auto:1&)_1_>
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  local_1e8 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_1c0);
  poVar2 = std::operator<<(&local_198,"INSERT INTO ");
  poVar2 = std::operator<<(poVar2,local_18);
  std::operator<<(poVar2," (");
  for (local_1f0 = 0; local_1f0 < local_1e8; local_1f0 = local_1f0 + 1) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_1c0,local_1f0);
    std::operator<<(&local_198,(string *)pvVar3);
    if (local_1f0 < local_1e8 - 1) {
      std::operator<<(&local_198,",");
    }
    std::operator<<(&local_198,anon_var_dwarf_389f0 + 0x38fc);
  }
  std::operator<<(&local_198,") ");
  std::operator<<(&local_198,"SELECT ");
  for (local_1f8 = 0; local_1f8 < local_1e8; local_1f8 = local_1f8 + 1) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_1c0,local_1f8);
    std::operator<<(&local_198,(string *)pvVar3);
    if (local_1f8 < local_1e8 - 1) {
      std::operator<<(&local_198,",");
    }
    std::operator<<(&local_198,anon_var_dwarf_389f0 + 0x38fc);
  }
  poVar2 = std::operator<<(&local_198,"FROM \'");
  poVar2 = std::operator<<(poVar2,in_RDI);
  std::operator<<(poVar2,"\' ");
  std::__cxx11::stringstream::str();
  uVar5 = local_10;
  uVar4 = std::__cxx11::string::c_str();
  iVar1 = sqlite3_prepare_v2(uVar5,uVar4,0xffffffff,&local_220,0);
  if (iVar1 == 0) {
    statement_finalizer::statement_finalizer(&local_228,local_220);
    iVar1 = sqlite3_step(local_220);
    if (iVar1 == 0x65) {
      statement_finalizer::~statement_finalizer((statement_finalizer *)0x23f00d);
      std::__cxx11::string::~string(local_218);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1c0);
      std::__cxx11::stringstream::~stringstream(local_1a8);
      return;
    }
    uVar5 = __cxa_allocate_exception(0x20);
    iVar1 = sqlite3_errcode(local_10);
    peVar6 = &get_sqlite_error_category()->super_error_category;
    std::error_code::error_code((error_code *)&stack0xfffffffffffffdc8,iVar1,peVar6);
    sqlite3_errmsg(local_10);
    std::system_error::system_error
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdb8);
    __cxa_throw(uVar5,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  uVar5 = __cxa_allocate_exception(0x20);
  iVar1 = sqlite3_errcode(local_10);
  peVar6 = &get_sqlite_error_category()->super_error_category;
  std::error_code::error_code((error_code *)&stack0xfffffffffffffdb8,iVar1,peVar6);
  sqlite3_errmsg(local_10);
  std::system_error::system_error
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdb8);
  __cxa_throw(uVar5,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

void
    copy_table(sqlite3 *db, const std::string &name, const std::vector<table_info *> &columnsToIgnore) const {
        std::ignore = columnsToIgnore;

        std::stringstream ss;
        std::vector<std::string> columnNames;
        this->table.for_each_column([&columnNames, &columnsToIgnore](auto &c) {
          auto &columnName = c.name;
          auto columnToIgnoreIt = std::find_if(columnsToIgnore.begin(),
                                               columnsToIgnore.end(),
                                               [&columnName](auto tableInfoPointer) {
                                                 return columnName == tableInfoPointer->name;
                                               });
          if(columnToIgnoreIt == columnsToIgnore.end()) {
              columnNames.emplace_back(columnName);
          }
        });
        auto columnNamesCount = columnNames.size();
        ss << "INSERT INTO " << name << " (";
        for(size_t i = 0; i < columnNamesCount; ++i) {
            ss << columnNames[i];
            if(i < columnNamesCount - 1) {
                ss << ",";
            }
            ss << " ";
        }
        ss << ") ";
        ss << "SELECT ";
        for(size_t i = 0; i < columnNamesCount; ++i) {
            ss << columnNames[i];
            if(i < columnNamesCount - 1) {
                ss << ",";
            }
            ss << " ";
        }
        ss << "FROM '" << this->table.name << "' ";
        auto query = ss.str();
        sqlite3_stmt *stmt;
        if(sqlite3_prepare_v2(db, query.c_str(), -1, &stmt, nullptr) == SQLITE_OK) {
            statement_finalizer finalizer{stmt};
            if(sqlite3_step(stmt) == SQLITE_DONE) {
                //..
            } else {
                throw std::system_error(std::error_code(sqlite3_errcode(db), get_sqlite_error_category()),
                                        sqlite3_errmsg(db));
            }
        } else {
            throw std::system_error(std::error_code(sqlite3_errcode(db), get_sqlite_error_category()),
                                    sqlite3_errmsg(db));
        }
    }